

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O2

void __thiscall
glcts::TessellationShaderInvarianceRule7Test::getIterationProperties
          (TessellationShaderInvarianceRule7Test *this,uint n_iteration,float *out_inner_tess_levels
          ,float *out_outer_tess_levels,bool *out_point_mode,
          _tessellation_primitive_mode *out_primitive_mode,
          _tessellation_shader_vertex_ordering *out_vertex_ordering,uint *out_result_buffer_size)

{
  _tessellation_primitive_mode primitive_mode;
  undefined8 uVar1;
  uint uVar2;
  _test_iteration *p_Var3;
  
  p_Var3 = getTestForIteration(this,n_iteration);
  *(undefined8 *)out_inner_tess_levels = *(undefined8 *)p_Var3->inner_tess_levels;
  uVar1 = *(undefined8 *)(p_Var3->outer_tess_levels + 2);
  *(undefined8 *)out_outer_tess_levels = *(undefined8 *)p_Var3->outer_tess_levels;
  *(undefined8 *)(out_outer_tess_levels + 2) = uVar1;
  *out_point_mode = false;
  primitive_mode = p_Var3->primitive_mode;
  *out_primitive_mode = primitive_mode;
  *out_vertex_ordering = p_Var3->vertex_ordering;
  if (out_result_buffer_size != (uint *)0x0) {
    uVar2 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                      ((this->super_TessellationShaderInvarianceBaseTest).m_utils_ptr,primitive_mode
                       ,out_inner_tess_levels,out_outer_tess_levels,
                       TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,false);
    *out_result_buffer_size = uVar2;
    p_Var3->n_vertices = uVar2;
    *out_result_buffer_size = *out_result_buffer_size * 0xc;
  }
  return;
}

Assistant:

void TessellationShaderInvarianceRule7Test::getIterationProperties(
	unsigned int n_iteration, float* out_inner_tess_levels, float* out_outer_tess_levels, bool* out_point_mode,
	_tessellation_primitive_mode* out_primitive_mode, _tessellation_shader_vertex_ordering* out_vertex_ordering,
	unsigned int* out_result_buffer_size)
{
	DE_ASSERT(m_test_triangles_iterations.size() + m_test_quads_iterations.size() > n_iteration);

	_test_iteration& test_iteration = getTestForIteration(n_iteration);

	memcpy(out_inner_tess_levels, test_iteration.inner_tess_levels, sizeof(test_iteration.inner_tess_levels));
	memcpy(out_outer_tess_levels, test_iteration.outer_tess_levels, sizeof(test_iteration.outer_tess_levels));

	*out_point_mode		 = false;
	*out_primitive_mode  = test_iteration.primitive_mode;
	*out_vertex_ordering = test_iteration.vertex_ordering;

	if (out_result_buffer_size != DE_NULL)
	{
		*out_result_buffer_size = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
			*out_primitive_mode, out_inner_tess_levels, out_outer_tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
			*out_point_mode);
		test_iteration.n_vertices = *out_result_buffer_size;
		*out_result_buffer_size =
			static_cast<unsigned int>(*out_result_buffer_size * 3 /* components */ * sizeof(float));

		DE_ASSERT(*out_result_buffer_size != 0);
	}
}